

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QJsonArray *a)

{
  long lVar1;
  QCborContainerPrivate *pQVar2;
  QDebug *pQVar3;
  undefined8 *in_RDX;
  char *t;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)a);
  if ((QCborContainerPrivate *)*in_RDX == (QCborContainerPrivate *)0x0) {
    QDebug::operator<<((QDebug *)a,"QJsonArray()");
    pQVar2 = (a->a).d.ptr;
    (a->a).d.ptr = (QCborContainerPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  }
  else {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_48.size = 0;
    QJsonPrivate::Writer::arrayToJson
              ((QCborContainerPrivate *)*in_RDX,(QByteArray *)&local_48,0,true);
    *(undefined1 *)&(((a->a).d.ptr)->elements).d.ptr = 0;
    pQVar3 = QDebug::operator<<((QDebug *)a,"QJsonArray(");
    t = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      t = &QByteArray::_empty;
    }
    pQVar3 = QDebug::operator<<(pQVar3,t);
    QDebug::operator<<(pQVar3,")");
    pQVar2 = (a->a).d.ptr;
    (a->a).d.ptr = (QCborContainerPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonArray &a)
{
    QDebugStateSaver saver(dbg);
    if (!a.a) {
        dbg << "QJsonArray()";
        return dbg;
    }
    QByteArray json;
    QJsonPrivate::Writer::arrayToJson(a.a.data(), json, 0, true);
    dbg.nospace() << "QJsonArray("
                  << json.constData() // print as utf-8 string without extra quotation marks
                  << ")";
    return dbg;
}